

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char_*>
fmt::v10::detail::format_decimal<char,unsigned__int128>(char *out,unsigned___int128 value,int size)

{
  undefined1 n [16];
  format_decimal_result<char_*> fVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t value_00;
  char *pcVar5;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar6 [16];
  char *end;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 uVar7;
  bool local_6d;
  int local_6c;
  undefined1 local_68 [16];
  char *local_50;
  char *local_30;
  char *local_10;
  char *local_8;
  
  n._8_8_ = in_stack_ffffffffffffff58;
  n._0_8_ = in_stack_ffffffffffffff50;
  local_6c = in_ECX;
  local_68._0_8_ = in_RSI;
  local_68._8_8_ = in_RDX;
  local_50 = (char *)in_RDI;
  iVar2 = count_digits((uint128_opt)n);
  local_6d = iVar2 <= in_ECX;
  ignore_unused<bool,char[20]>(&local_6d,(char (*) [20])"invalid digit count");
  auVar6._8_8_ = local_68._8_8_;
  auVar6._0_8_ = local_68._0_8_;
  pcVar3 = (char *)((long)local_50 + (long)local_6c);
  local_50 = pcVar3;
  while (local_68._8_8_ = auVar6._8_8_, local_68._0_8_ = auVar6._0_8_,
        (ulong)((ulong)local_68._0_8_ < 100) <= (ulong)local_68._8_8_) {
    pcVar4 = local_50 + -2;
    uVar7 = 100;
    local_50 = pcVar4;
    value_00 = __umodti3(local_68._0_8_,local_68._8_8_);
    local_68 = auVar6;
    local_10 = digits2(value_00);
    *(undefined2 *)pcVar4 = *(undefined2 *)local_10;
    local_8 = pcVar4;
    auVar6 = __udivti3(local_68._0_8_,local_68._8_8_,uVar7,0);
  }
  if (local_68._8_8_ == 0 && (ulong)(9 < (ulong)local_68._0_8_) <= (ulong)-local_68._8_8_) {
    local_68[0] = auVar6[0];
    local_30 = local_50 + -1;
    local_50[-1] = local_68[0] + '0';
  }
  else {
    pcVar4 = local_50 + -2;
    local_50 = pcVar4;
    pcVar5 = digits2(local_68._0_8_);
    local_68 = auVar6;
    *(undefined2 *)pcVar4 = *(undefined2 *)pcVar5;
    local_30 = local_50;
  }
  fVar1.end = pcVar3;
  fVar1.begin = local_30;
  return fVar1;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}